

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

R_conflict6 * parse_scope(QByteArrayView qualifiedKey)

{
  long lVar1;
  QByteArrayView a;
  bool bVar2;
  qsizetype qVar3;
  storage_type *in_RDX;
  qsizetype in_RSI;
  R_conflict6 *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  qsizetype scopePos;
  QByteArrayView *in_stack_ffffffffffffff48;
  optional<QByteArrayView> *in_stack_ffffffffffffff50;
  QByteArrayView *pQVar5;
  QByteArrayView *in_stack_ffffffffffffff58;
  QByteArrayView *in_stack_ffffffffffffff60;
  R_conflict6 *pos;
  qsizetype in_stack_ffffffffffffff70;
  storage_type *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArrayView::QByteArrayView<8ul>
            (in_stack_ffffffffffffff60,(char (*) [8])in_stack_ffffffffffffff58);
  QVar4.m_data = in_stack_ffffffffffffff78;
  QVar4.m_size = in_stack_ffffffffffffff70;
  bVar2 = QByteArrayView::startsWith(in_stack_ffffffffffffff48,QVar4);
  if ((bVar2) &&
     (bVar2 = QByteArrayView::endsWith
                        (in_stack_ffffffffffffff60,(char)((ulong)in_stack_ffffffffffffff58 >> 0x38))
     , bVar2)) {
    QByteArrayView::length((QByteArrayView *)0x364da3);
    QByteArrayView::slice
              (in_stack_ffffffffffffff58,(qsizetype)in_stack_ffffffffffffff50,
               (qsizetype)in_stack_ffffffffffffff48);
  }
  Qt::Literals::StringLiterals::operator____L1
            ((char *)in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
  QByteArrayView::QByteArrayView<QLatin1String,_true>
            (in_stack_ffffffffffffff60,(QLatin1String *)in_stack_ffffffffffffff58);
  a.m_data = in_stack_ffffffffffffff78;
  a.m_size = in_stack_ffffffffffffff70;
  qVar3 = QByteArrayView::lastIndexOf(in_stack_ffffffffffffff58,a);
  if (qVar3 < 0) {
    std::optional<QByteArrayView>::optional(&in_RDI->scope);
    (in_RDI->key).m_size = in_RSI;
    (in_RDI->key).m_data = in_RDX;
  }
  else {
    pos = in_RDI;
    QVar4 = QByteArrayView::first(in_stack_ffffffffffffff48,0x364e5c);
    std::optional<QByteArrayView>::optional<QByteArrayView,_true>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pQVar5 = &in_RDI->key;
    QVar4 = QByteArrayView::sliced((QByteArrayView *)QVar4.m_data,(qsizetype)pos);
    *pQVar5 = QVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static auto parse_scope(QByteArrayView qualifiedKey) noexcept
{
    struct R {
        std::optional<QByteArrayView> scope;
        QByteArrayView key;
    };
    if (qualifiedKey.startsWith("QFlags<") && qualifiedKey.endsWith('>'))
        qualifiedKey.slice(7, qualifiedKey.length() - 8);
    const auto scopePos = qualifiedKey.lastIndexOf("::"_L1);
    if (scopePos < 0)
        return R{std::nullopt, qualifiedKey};
    else
        return R{qualifiedKey.first(scopePos), qualifiedKey.sliced(scopePos + 2)};
}